

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<std::__cxx11::string>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char **ppcVar1;
  Queue *pQVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  size_t sizes [3];
  long local_48 [3];
  
  local_48[0] = 8;
  local_48[1] = 8;
  local_48[2] = args->_M_string_length + 4;
  lVar7 = 0;
  lVar4 = 0;
  do {
    lVar7 = lVar7 + *(long *)((long)local_48 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  uVar8 = lVar7 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8) {
    sVar5 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar5 < uVar8) &&
        (replaceChannel(this,uVar8),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8)) &&
       (sVar5 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar5 < uVar8)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar7;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 4;
  *(uint64_t *)(pcVar6 + 4) = eventSourceId;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  *(uint64_t *)(pcVar6 + 8) = clock;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  uVar8 = args->_M_string_length;
  iVar3 = (int)uVar8;
  *(int *)(pcVar6 + 8) = iVar3;
  pcVar6 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar6;
  if (iVar3 != 0) {
    uVar8 = uVar8 & 0xffffffff;
    memcpy(pcVar6,(args->_M_dataplus)._M_p,uVar8);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar8;
  }
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}